

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t create_dir(archive_write_disk *a,char *path)

{
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int *piVar6;
  fixup_entry *pfVar7;
  wchar_t r;
  mode_t mode;
  mode_t mode_final;
  char *base;
  char *slash;
  fixup_entry *le;
  stat_conflict1 st;
  char *path_local;
  archive_write_disk *a_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)path;
  pcVar5 = strrchr(path,0x2f);
  if (pcVar5 == (char *)0x0) {
    _mode = (char *)st.__glibc_reserved[2];
  }
  else {
    _mode = pcVar5 + 1;
  }
  if (((*_mode == '\0') || ((*_mode == '.' && (_mode[1] == '\0')))) ||
     ((*_mode == '.' && ((_mode[1] == '.' && (_mode[2] == '\0')))))) {
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      wVar1 = create_dir(a,(char *)st.__glibc_reserved[2]);
      *pcVar5 = '/';
      return wVar1;
    }
    return L'\0';
  }
  iVar2 = stat((char *)st.__glibc_reserved[2],(stat *)&le);
  if (iVar2 == 0) {
    if (((uint)st.st_nlink & 0xf000) == 0x4000) {
      return L'\0';
    }
    if ((a->flags & 8U) != 0) {
      archive_set_error(&a->archive,0x11,"Can\'t create directory \'%s\'",st.__glibc_reserved[2]);
      return L'\xffffffe7';
    }
    iVar2 = unlink((char *)st.__glibc_reserved[2]);
    if (iVar2 != 0) {
      piVar6 = __errno_location();
      archive_set_error(&a->archive,*piVar6,
                        "Can\'t create directory \'%s\': Conflicting file cannot be removed",
                        st.__glibc_reserved[2]);
      return L'\xffffffe7';
    }
  }
  else {
    piVar6 = __errno_location();
    if ((*piVar6 != 2) && (piVar6 = __errno_location(), *piVar6 != 0x14)) {
      piVar6 = __errno_location();
      archive_set_error(&a->archive,*piVar6,"Can\'t test directory \'%s\'",st.__glibc_reserved[2]);
      return L'\xffffffe7';
    }
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      wVar1 = create_dir(a,(char *)st.__glibc_reserved[2]);
      *pcVar5 = '/';
      if (wVar1 != L'\0') {
        return wVar1;
      }
    }
  }
  uVar3 = a->user_umask ^ 0xffffffff;
  uVar4 = uVar3 & 0x1ff;
  uVar3 = uVar3 & 0x1fd | 0x1c0;
  iVar2 = mkdir((char *)st.__glibc_reserved[2],uVar3);
  if (iVar2 == 0) {
    if (uVar3 != uVar4) {
      pfVar7 = new_fixup(a,(char *)st.__glibc_reserved[2]);
      if (pfVar7 == (fixup_entry *)0x0) {
        return L'\xffffffe2';
      }
      pfVar7->fixup = pfVar7->fixup | 0x20000000;
      pfVar7->mode = uVar4;
    }
    a_local._4_4_ = L'\0';
  }
  else {
    iVar2 = stat((char *)st.__glibc_reserved[2],(stat *)&le);
    if ((iVar2 == 0) && (((uint)st.st_nlink & 0xf000) == 0x4000)) {
      a_local._4_4_ = L'\0';
    }
    else {
      piVar6 = __errno_location();
      archive_set_error(&a->archive,*piVar6,"Failed to create dir \'%s\'",st.__glibc_reserved[2]);
      a_local._4_4_ = L'\xffffffe7';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
create_dir(struct archive_write_disk *a, char *path)
{
	struct stat st;
	struct fixup_entry *le;
	char *slash, *base;
	mode_t mode_final, mode;
	int r;

	/* Check for special names and just skip them. */
	slash = strrchr(path, '/');
	if (slash == NULL)
		base = path;
	else
		base = slash + 1;

	if (base[0] == '\0' ||
	    (base[0] == '.' && base[1] == '\0') ||
	    (base[0] == '.' && base[1] == '.' && base[2] == '\0')) {
		/* Don't bother trying to create null path, '.', or '..'. */
		if (slash != NULL) {
			*slash = '\0';
			r = create_dir(a, path);
			*slash = '/';
			return (r);
		}
		return (ARCHIVE_OK);
	}

	/*
	 * Yes, this should be stat() and not lstat().  Using lstat()
	 * here loses the ability to extract through symlinks.  Also note
	 * that this should not use the a->st cache.
	 */
	if (la_stat(path, &st) == 0) {
		if (S_ISDIR(st.st_mode))
			return (ARCHIVE_OK);
		if ((a->flags & ARCHIVE_EXTRACT_NO_OVERWRITE)) {
			archive_set_error(&a->archive, EEXIST,
			    "Can't create directory '%s'", path);
			return (ARCHIVE_FAILED);
		}
		if (unlink(path) != 0) {
			archive_set_error(&a->archive, errno,
			    "Can't create directory '%s': "
			    "Conflicting file cannot be removed",
			    path);
			return (ARCHIVE_FAILED);
		}
	} else if (errno != ENOENT && errno != ENOTDIR) {
		/* Stat failed? */
		archive_set_error(&a->archive, errno,
		    "Can't test directory '%s'", path);
		return (ARCHIVE_FAILED);
	} else if (slash != NULL) {
		*slash = '\0';
		r = create_dir(a, path);
		*slash = '/';
		if (r != ARCHIVE_OK)
			return (r);
	}

	/*
	 * Mode we want for the final restored directory.  Per POSIX,
	 * implicitly-created dirs must be created obeying the umask.
	 * There's no mention whether this is different for privileged
	 * restores (which the rest of this code handles by pretending
	 * umask=0).  I've chosen here to always obey the user's umask for
	 * implicit dirs, even if _EXTRACT_PERM was specified.
	 */
	mode_final = DEFAULT_DIR_MODE & ~a->user_umask;
	/* Mode we want on disk during the restore process. */
	mode = mode_final;
	mode |= MINIMUM_DIR_MODE;
	mode &= MAXIMUM_DIR_MODE;
	if (mkdir(path, mode) == 0) {
		if (mode != mode_final) {
			le = new_fixup(a, path);
			if (le == NULL)
				return (ARCHIVE_FATAL);
			le->fixup |=TODO_MODE_BASE;
			le->mode = mode_final;
		}
		return (ARCHIVE_OK);
	}

	/*
	 * Without the following check, a/b/../b/c/d fails at the
	 * second visit to 'b', so 'd' can't be created.  Note that we
	 * don't add it to the fixup list here, as it's already been
	 * added.
	 */
	if (la_stat(path, &st) == 0 && S_ISDIR(st.st_mode))
		return (ARCHIVE_OK);

	archive_set_error(&a->archive, errno, "Failed to create dir '%s'",
	    path);
	return (ARCHIVE_FAILED);
}